

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O2

CgreenVector * sorted_test_items_from(CgreenVector *test_items)

{
  int iVar1;
  int iVar2;
  CgreenVector *pCVar3;
  char *__s1;
  char *__s2;
  undefined8 uVar4;
  int i;
  int index;
  
  pCVar3 = (CgreenVector *)create_cgreen_vector(destroy_test_item);
  while( true ) {
    iVar1 = cgreen_vector_size(test_items);
    if (iVar1 < 2) break;
    iVar1 = 0;
    __s1 = test_name_of_element(test_items,0);
    index = 1;
    while( true ) {
      iVar2 = cgreen_vector_size(test_items);
      if (iVar2 <= index) break;
      __s2 = test_name_of_element(test_items,index);
      iVar2 = strcmp(__s1,__s2);
      if (0 < iVar2) {
        __s1 = test_name_of_element(test_items,index);
        iVar1 = index;
      }
      index = index + 1;
    }
    cgreen_vector_remove(test_items,iVar1);
    cgreen_vector_add(pCVar3);
  }
  iVar1 = cgreen_vector_size(test_items);
  if (iVar1 == 1) {
    uVar4 = cgreen_vector_remove(test_items,0);
    cgreen_vector_add(pCVar3,uVar4);
    destroy_cgreen_vector(test_items);
  }
  return pCVar3;
}

Assistant:

static CgreenVector *sorted_test_items_from(CgreenVector *test_items) {
    CgreenVector *sorted = create_cgreen_vector((GenericDestructor)destroy_test_item);
    while (cgreen_vector_size(test_items) > 1) {
        int smallest = 0;
        const char *smallest_test_name = test_name_of_element(test_items, smallest);
        for (int i=1; i<cgreen_vector_size(test_items); i++) {
            const char *current_test_name = test_name_of_element(test_items, i);
            if (strcmp(smallest_test_name, current_test_name) > 0) {
                smallest = i;
                smallest_test_name = test_name_of_element(test_items, smallest);
            }
        }
        cgreen_vector_add(sorted, cgreen_vector_remove(test_items, smallest));
    }
    if (cgreen_vector_size(test_items) == 1) {
        cgreen_vector_add(sorted, cgreen_vector_remove(test_items, 0));
        destroy_cgreen_vector(test_items);
    }
    return sorted;
}